

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppleII.cpp
# Opt level: O3

Cycles __thiscall
Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_true>::perform_bus_operation
          (ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_true> *this,
          BusOperation operation,uint16_t address,uint8_t *value)

{
  char cVar1;
  pointer ppCVar2;
  Cycles CVar3;
  StringSerialiser *pSVar4;
  _Head_base<0UL,_Apple::II::Card_*,_false> _Var5;
  Card *pCVar6;
  pointer puVar7;
  char *__name;
  ushort uVar8;
  uint8_t uVar9;
  bool bVar10;
  byte bVar11;
  byte bVar12;
  ulong uVar13;
  uint uVar14;
  iterator __end4;
  WrappedInt<Cycles> length;
  undefined8 uVar15;
  vector<Apple::II::Card*,std::allocator<Apple::II::Card*>> *this_00;
  uint uVar16;
  long lVar17;
  Card **card;
  pointer ppCVar18;
  float fVar19;
  float fVar20;
  undefined8 local_60;
  Card *local_48;
  ulong local_40;
  Card *local_38;
  
  length.length_ = (this->cycles_since_video_update_).super_WrappedInt<Cycles>.length_ + 1;
  (this->cycles_since_video_update_).super_WrappedInt<Cycles>.length_ = length.length_;
  (this->cycles_since_card_update_).super_WrappedInt<Cycles>.length_ =
       (this->cycles_since_card_update_).super_WrappedInt<Cycles>.length_ + 1;
  lVar17 = (this->cycles_since_audio_update_).super_WrappedInt<Cycles>.length_;
  (this->cycles_since_audio_update_).super_WrappedInt<Cycles>.length_ = lVar17 + 7;
  uVar16 = (this->cycles_into_current_line_ + 1) % 0x41;
  this->cycles_into_current_line_ = uVar16;
  if (uVar16 == 0) {
    (this->cycles_since_audio_update_).super_WrappedInt<Cycles>.length_ = lVar17 + 8;
    this->stretched_cycles_since_card_update_ = this->stretched_cycles_since_card_update_ + 1;
  }
  __name = (char *)(ulong)address;
  uVar8 = address >> 8;
  if (this->read_pages_[uVar8] != (uint8_t *)0x0) {
    if (4 < (int)operation) {
      if ((ushort)(address - 0x200) < 0x5e00) {
        (this->cycles_since_video_update_).super_WrappedInt<Cycles>.length_ = 0;
        DeferredQueuePerformer<Cycles>::run_for
                  (&(this->video_).super_VideoBase.super_VideoSwitches<Cycles>.deferrer_,
                   (Cycles)length.length_);
      }
      if (this->write_pages_[uVar8] != (uint8_t *)0x0) {
        this->write_pages_[uVar8][(ulong)__name & 0xff] = *value;
      }
      goto switchD_0027161f_caseD_c05e;
    }
    bVar11 = this->read_pages_[uVar8][(ulong)__name & 0xff];
LAB_00271588:
    *value = bVar11;
    goto switchD_0027161f_caseD_c05e;
  }
  if (address != 0xc000 && (int)operation < 5) {
    if ((this->video_).super_VideoBase.super_VideoSwitches<Cycles>.deferrer_.
        super_DeferredQueue<Cycles>.pending_actions_.
        super__Vector_base<DeferredQueue<Cycles>::DeferredAction,_std::allocator<DeferredQueue<Cycles>::DeferredAction>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->video_).super_VideoBase.super_VideoSwitches<Cycles>.deferrer_.
        super_DeferredQueue<Cycles>.pending_actions_.
        super__Vector_base<DeferredQueue<Cycles>::DeferredAction,_std::allocator<DeferredQueue<Cycles>::DeferredAction>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      (this->cycles_since_video_update_).super_WrappedInt<Cycles>.length_ = 0;
      DeferredQueuePerformer<Cycles>::run_for
                (&(this->video_).super_VideoBase.super_VideoSwitches<Cycles>.deferrer_,
                 (Cycles)length.length_);
      length.length_ = (this->cycles_since_video_update_).super_WrappedInt<Cycles>.length_;
    }
    uVar9 = II::Video::
            Video<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_true>::VideoBusHandler,_false>
            ::get_last_read_value(&this->video_,(Cycles)length.length_);
    *value = uVar9;
  }
  bVar11 = (byte)address;
  switch(address) {
  case 0xc030:
  case 0xc031:
  case 0xc032:
  case 0xc033:
  case 0xc034:
  case 0xc035:
  case 0xc036:
  case 0xc037:
  case 0xc038:
  case 0xc039:
  case 0xc03a:
  case 0xc03b:
  case 0xc03c:
  case 0xc03d:
  case 0xc03e:
  case 0xc03f:
    CVar3.super_WrappedInt<Cycles>.length_ =
         (WrappedInt<Cycles>)(this->cycles_since_audio_update_).super_WrappedInt<Cycles>.length_;
    (this->cycles_since_audio_update_).super_WrappedInt<Cycles>.length_ = 0;
    Outputs::Speaker::
    PullLowpass<Outputs::Speaker::CompoundSource<(anonymous_namespace)::StretchedAYPair,_Audio::Toggle>_>
    ::run_for(&this->speaker_,&this->audio_queue_,CVar3);
    bVar10 = Audio::Toggle::get_output(&this->audio_toggle_);
    Audio::Toggle::set_output(&this->audio_toggle_,!bVar10);
    break;
  case 0xc040:
  case 0xc041:
  case 0xc042:
  case 0xc043:
  case 0xc044:
  case 0xc045:
  case 0xc046:
  case 0xc047:
  case 0xc048:
  case 0xc049:
  case 0xc04a:
  case 0xc04b:
  case 0xc04c:
  case 0xc04d:
  case 0xc04e:
  case 0xc04f:
  case 0xc058:
  case 0xc059:
  case 0xc05a:
  case 0xc05b:
  case 0xc05c:
  case 0xc05d:
  case 0xc060:
  case 0xc061:
  case 0xc062:
  case 0xc063:
  case 0xc064:
  case 0xc065:
  case 0xc066:
  case 0xc067:
  case 0xc068:
  case 0xc069:
  case 0xc06a:
  case 0xc06b:
  case 0xc06c:
  case 0xc06d:
  case 0xc06e:
  case 0xc06f:
  case 0xc071:
  case 0xc072:
  case 0xc073:
  case 0xc074:
  case 0xc075:
  case 0xc076:
  case 0xc077:
  case 0xc078:
  case 0xc079:
  case 0xc07a:
  case 0xc07b:
  case 0xc07c:
  case 0xc07d:
  case 0xc07e:
  case 0xc07f:
switchD_0027161f_caseD_c040:
    uVar14 = (uint)address;
    if ((int)operation < 5) {
      switch(uVar14) {
      case 0xc000:
      case 0xc011:
      case 0xc012:
      case 0xc013:
      case 0xc014:
      case 0xc015:
      case 0xc016:
      case 0xc017:
      case 0xc018:
      case 0xc019:
      case 0xc01a:
      case 0xc01b:
      case 0xc01c:
      case 0xc01d:
      case 0xc01e:
      case 0xc01f:
        pSVar4 = (this->keyboard_).string_serialiser_._M_t.
                 super___uniq_ptr_impl<Utility::StringSerialiser,_std::default_delete<Utility::StringSerialiser>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Utility::StringSerialiser_*,_std::default_delete<Utility::StringSerialiser>_>
                 .super__Head_base<0UL,_Utility::StringSerialiser_*,_false>._M_head_impl;
        if (pSVar4 == (StringSerialiser *)0x0) {
          bVar11 = (this->keyboard_).keyboard_input_;
        }
        else {
          bVar11 = Utility::StringSerialiser::head(pSVar4);
          bVar11 = bVar11 | 0x80;
        }
        *value = bVar11;
        break;
      case 0xc001:
      case 0xc002:
      case 0xc003:
      case 0xc004:
      case 0xc005:
      case 0xc006:
      case 0xc007:
      case 0xc008:
      case 0xc009:
      case 0xc00a:
      case 0xc00b:
      case 0xc00c:
      case 0xc00d:
      case 0xc00e:
      case 0xc00f:
        bVar11 = *value;
        pSVar4 = (this->keyboard_).string_serialiser_._M_t.
                 super___uniq_ptr_impl<Utility::StringSerialiser,_std::default_delete<Utility::StringSerialiser>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Utility::StringSerialiser_*,_std::default_delete<Utility::StringSerialiser>_>
                 .super__Head_base<0UL,_Utility::StringSerialiser_*,_false>._M_head_impl;
        if (pSVar4 == (StringSerialiser *)0x0) {
          bVar12 = (this->keyboard_).keyboard_input_;
        }
        else {
          bVar12 = Utility::StringSerialiser::head(pSVar4);
        }
        *value = bVar12 & 0x7f | bVar11 & 0x80;
        break;
      case 0xc010:
        goto switchD_0027192d_caseD_c010;
      default:
        switch(uVar14) {
        case 0xc061:
          bVar11 = *value;
          *value = bVar11 & 0x7f;
          puVar7 = (this->joysticks_).joysticks_.
                   super__Vector_base<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>,_std::allocator<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (*(char *)((long)(puVar7->_M_t).
                              super___uniq_ptr_impl<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>
                              ._M_t + 0x40) == '\0') {
            cVar1 = *(char *)((long)puVar7[1]._M_t.
                                    super___uniq_ptr_impl<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>
                                    ._M_t + 0x42);
joined_r0x00271c09:
            if (cVar1 != '\x01') goto switchD_0027161f_caseD_c05e;
          }
          break;
        case 0xc062:
          bVar11 = *value;
          *value = bVar11 & 0x7f;
          puVar7 = (this->joysticks_).joysticks_.
                   super__Vector_base<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>,_std::allocator<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (*(char *)((long)(puVar7->_M_t).
                              super___uniq_ptr_impl<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>
                              ._M_t + 0x41) == '\0') {
            cVar1 = *(char *)((long)puVar7[1]._M_t.
                                    super___uniq_ptr_impl<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>
                                    ._M_t + 0x41);
            goto joined_r0x00271c09;
          }
          break;
        case 0xc063:
          bVar11 = *value;
          *value = bVar11 & 0x7f;
          puVar7 = (this->joysticks_).joysticks_.
                   super__Vector_base<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>,_std::allocator<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (*(char *)((long)(puVar7->_M_t).
                              super___uniq_ptr_impl<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>
                              ._M_t + 0x42) == '\0') {
            cVar1 = *(char *)((long)puVar7[1]._M_t.
                                    super___uniq_ptr_impl<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>
                                    ._M_t + 0x40);
            goto joined_r0x00271c09;
          }
          break;
        case 0xc064:
        case 0xc065:
        case 0xc066:
        case 0xc067:
          uVar14 = uVar14 - 0xc064;
          bVar11 = *value;
          *value = bVar11 & 0x7f;
          if (1.0 - *(float *)((long)(this->joysticks_).joysticks_.
                                     super__Vector_base<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>,_std::allocator<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar14 >> 1]._M_t.
                                     super___uniq_ptr_impl<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>
                                     ._M_t + 0x44 + (ulong)(uVar14 & 1) * 4) <
              (this->joysticks_).analogue_charge_ + (this->joysticks_).analogue_biases_[uVar14])
          goto switchD_0027161f_caseD_c05e;
          break;
        default:
          goto switchD_0027192d_caseD_c010;
        }
        bVar11 = bVar11 | 0x80;
        goto LAB_00271588;
      }
    }
    else {
switchD_0027192d_caseD_c010:
      if (((ushort)(address + 0x3f70) < 0xf70) && (this->read_pages_[uVar8] == (uint8_t *)0x0)) {
        if (address < 0xc800) {
          if (address < 0xc100) {
            uVar13 = (ulong)(uVar14 - 0xc090 >> 4);
            local_60 = 1;
          }
          else {
            uVar13 = (ulong)(uVar14 - 0xc100 >> 8);
            this->active_card_ = uVar13;
            local_60 = 2;
          }
        }
        else {
          uVar13 = this->active_card_;
          local_60 = 4;
          if (address == 0xcfff) {
            this->active_card_ = 7;
          }
        }
        _Var5._M_head_impl =
             (this->cards_)._M_elems[uVar13]._M_t.
             super___uniq_ptr_impl<Apple::II::Card,_std::default_delete<Apple::II::Card>_>._M_t.
             super__Tuple_impl<0UL,_Apple::II::Card_*,_std::default_delete<Apple::II::Card>_>.
             super__Head_base<0UL,_Apple::II::Card_*,_false>._M_head_impl;
        if ((_Var5._M_head_impl != (Card *)0x0) && ((_Var5._M_head_impl)->select_constraints_ != 0))
        {
          local_40 = (ulong)uVar16;
          update_just_in_time_cards(this);
          (**(code **)((long)(_Var5._M_head_impl)->_vptr_Card + 0x20))
                    (_Var5._M_head_impl,local_60,(ulong)((int)operation < 5),__name,value);
          uVar16 = (uint)local_40;
        }
        ppCVar18 = (this->every_cycle_cards_).
                   super__Vector_base<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>._M_impl
                   .super__Vector_impl_data._M_start;
        ppCVar2 = (this->every_cycle_cards_).
                  super__Vector_base<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        local_38 = _Var5._M_head_impl;
        if (ppCVar18 != ppCVar2) {
          do {
            (*(*ppCVar18)->_vptr_Card[2])(*ppCVar18,1,(ulong)(uVar16 == 0));
            pCVar6 = *ppCVar18;
            uVar15 = 0;
            if (pCVar6 == local_38) {
              uVar15 = local_60;
            }
            (*pCVar6->_vptr_Card[4])(pCVar6,uVar15,(ulong)((int)operation < 5),__name,value);
            ppCVar18 = ppCVar18 + 1;
          } while (ppCVar18 != ppCVar2);
        }
        goto LAB_0027172d;
      }
    }
    break;
  case 0xc050:
  case 0xc051:
    CVar3.super_WrappedInt<Cycles>.length_ =
         (WrappedInt<Cycles>)(this->cycles_since_video_update_).super_WrappedInt<Cycles>.length_;
    (this->cycles_since_video_update_).super_WrappedInt<Cycles>.length_ = 0;
    DeferredQueuePerformer<Cycles>::run_for
              (&(this->video_).super_VideoBase.super_VideoSwitches<Cycles>.deferrer_,CVar3);
    VideoSwitches<Cycles>::set_text((VideoSwitches<Cycles> *)&this->video_,(bool)(bVar11 & 1));
    break;
  case 0xc052:
    CVar3.super_WrappedInt<Cycles>.length_ =
         (WrappedInt<Cycles>)(this->cycles_since_video_update_).super_WrappedInt<Cycles>.length_;
    (this->cycles_since_video_update_).super_WrappedInt<Cycles>.length_ = 0;
    DeferredQueuePerformer<Cycles>::run_for
              (&(this->video_).super_VideoBase.super_VideoSwitches<Cycles>.deferrer_,CVar3);
    bVar10 = false;
    goto LAB_002719bb;
  case 0xc053:
    CVar3.super_WrappedInt<Cycles>.length_ =
         (WrappedInt<Cycles>)(this->cycles_since_video_update_).super_WrappedInt<Cycles>.length_;
    (this->cycles_since_video_update_).super_WrappedInt<Cycles>.length_ = 0;
    DeferredQueuePerformer<Cycles>::run_for
              (&(this->video_).super_VideoBase.super_VideoSwitches<Cycles>.deferrer_,CVar3);
    bVar10 = true;
LAB_002719bb:
    VideoSwitches<Cycles>::set_mixed((VideoSwitches<Cycles> *)&this->video_,bVar10);
    break;
  case 0xc054:
  case 0xc055:
    CVar3.super_WrappedInt<Cycles>.length_ =
         (WrappedInt<Cycles>)(this->cycles_since_video_update_).super_WrappedInt<Cycles>.length_;
    (this->cycles_since_video_update_).super_WrappedInt<Cycles>.length_ = 0;
    DeferredQueuePerformer<Cycles>::run_for
              (&(this->video_).super_VideoBase.super_VideoSwitches<Cycles>.deferrer_,CVar3);
    (this->video_).super_VideoBase.super_VideoSwitches<Cycles>.internal_.page2 = (bool)(bVar11 & 1);
    (this->video_).super_VideoBase.super_VideoSwitches<Cycles>.external_.page2 = (bool)(bVar11 & 1);
    goto LAB_002718df;
  case 0xc056:
  case 0xc057:
    CVar3.super_WrappedInt<Cycles>.length_ =
         (WrappedInt<Cycles>)(this->cycles_since_video_update_).super_WrappedInt<Cycles>.length_;
    (this->cycles_since_video_update_).super_WrappedInt<Cycles>.length_ = 0;
    DeferredQueuePerformer<Cycles>::run_for
              (&(this->video_).super_VideoBase.super_VideoSwitches<Cycles>.deferrer_,CVar3);
    VideoSwitches<Cycles>::set_high_resolution
              ((VideoSwitches<Cycles> *)&this->video_,(bool)(bVar11 & 1));
LAB_002718df:
    AuxiliaryMemorySwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_true>_>
    ::access(&this->auxiliary_switches_,__name,(uint)((int)operation < 5));
    break;
  case 0xc05e:
  case 0xc05f:
    break;
  case 0xc070:
    JoystickPair::access_c070(&this->joysticks_);
    break;
  case 0xc080:
  case 0xc081:
  case 0xc082:
  case 0xc083:
  case 0xc084:
  case 0xc085:
  case 0xc086:
  case 0xc087:
  case 0xc088:
  case 0xc089:
  case 0xc08a:
  case 0xc08b:
  case 0xc08c:
  case 0xc08d:
  case 0xc08e:
  case 0xc08f:
    LanguageCardSwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_true>_>
    ::access(&this->language_card_,__name,(uint)((int)operation < 5));
    break;
  default:
    if (address != 0xc010) goto switchD_0027161f_caseD_c040;
    Keyboard::clear_keyboard_input(&this->keyboard_);
  }
switchD_0027161f_caseD_c05e:
  ppCVar18 = (this->every_cycle_cards_).
             super__Vector_base<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppCVar2 = (this->every_cycle_cards_).
            super__Vector_base<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar18 != ppCVar2) {
    do {
      (*(*ppCVar18)->_vptr_Card[2])(*ppCVar18,1,(ulong)(uVar16 == 0));
      (*(*ppCVar18)->_vptr_Card[4])(*ppCVar18,0,(ulong)((int)operation < 5),__name,value);
      ppCVar18 = ppCVar18 + 1;
    } while (ppCVar18 != ppCVar2);
  }
LAB_0027172d:
  if (this->card_lists_are_dirty_ == true) {
    this->card_lists_are_dirty_ = false;
    if (this->card_became_just_in_time_ == true) {
      this->card_became_just_in_time_ = false;
      update_just_in_time_cards(this);
    }
    ppCVar18 = (this->every_cycle_cards_).
               super__Vector_base<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if ((this->every_cycle_cards_).
        super__Vector_base<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppCVar18) {
      (this->every_cycle_cards_).
      super__Vector_base<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppCVar18;
    }
    ppCVar18 = (this->just_in_time_cards_).
               super__Vector_base<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if ((this->just_in_time_cards_).
        super__Vector_base<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppCVar18) {
      (this->just_in_time_cards_).
      super__Vector_base<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppCVar18;
    }
    lVar17 = 0;
    do {
      local_48 = *(Card **)((long)&(this->cards_)._M_elems[0]._M_t.
                                   super___uniq_ptr_impl<Apple::II::Card,_std::default_delete<Apple::II::Card>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_Apple::II::Card_*,_std::default_delete<Apple::II::Card>_>
                                   .super__Head_base<0UL,_Apple::II::Card_*,_false>._M_head_impl +
                           lVar17);
      if (local_48 != (Card *)0x0) {
        this_00 = (vector<Apple::II::Card*,std::allocator<Apple::II::Card*>> *)
                  &this->every_cycle_cards_;
        if (local_48->select_constraints_ != 0) {
          this_00 = (vector<Apple::II::Card*,std::allocator<Apple::II::Card*>> *)
                    &this->just_in_time_cards_;
        }
        std::vector<Apple::II::Card*,std::allocator<Apple::II::Card*>>::
        emplace_back<Apple::II::Card*>(this_00,&local_48);
      }
      lVar17 = lVar17 + 8;
    } while (lVar17 != 0x40);
  }
  fVar19 = (this->joysticks_).analogue_charge_ + 0.00035460992;
  fVar20 = 1.1;
  if (fVar19 <= 1.1) {
    fVar20 = fVar19;
  }
  (this->joysticks_).analogue_charge_ = fVar20;
  return (Cycles)1;
}

Assistant:

forceinline Cycles perform_bus_operation(const CPU::MOS6502::BusOperation operation, const uint16_t address, uint8_t *const value) {
			++ cycles_since_video_update_;
			++ cycles_since_card_update_;
			cycles_since_audio_update_ += Cycles(7);

			// The Apple II has a slightly weird timing pattern: every 65th CPU cycle is stretched
			// by an extra 1/7th. That's because one cycle lasts 3.5 NTSC colour clocks, so after
			// 65 cycles a full line of 227.5 colour clocks have passed. But the high-rate binary
			// signal approximation that produces colour needs to be in phase, so a stretch of exactly
			// 0.5 further colour cycles is added. The video class handles that implicitly, but it
			// needs to be accumulated here for the audio.
			cycles_into_current_line_ = (cycles_into_current_line_ + 1) % 65;
			const bool is_stretched_cycle = !cycles_into_current_line_;
			if(is_stretched_cycle) {
				++ cycles_since_audio_update_;
				++ stretched_cycles_since_card_update_;
			}

			bool has_updated_cards = false;
			if(read_pages_[address >> 8]) {
				if(isReadOperation(operation)) *value = read_pages_[address >> 8][address & 0xff];
				else {
					if(address >= 0x200 && address < 0x6000) update_video();
					if(write_pages_[address >> 8]) write_pages_[address >> 8][address & 0xff] = *value;
				}

				if(is_iie(model)) {
					auxiliary_switches_.access(address, isReadOperation(operation));
				}
			} else {
				// Assume a vapour read unless it turns out otherwise; this is a little
				// wasteful but works for now.
				//
				// Longer version: like many other machines, when the Apple II reads from
				// an address at which no hardware loads the data bus, through a process of
				// practical analogue effects it'll end up receiving whatever was last on
				// the bus. Which will always be whatever the video circuit fetched because
				// that fetches in between every instruction.
				//
				// So this code assumes that'll happen unless it later determines that it
				// doesn't. The call into the video isn't free because it's a just-in-time
				// actor, but this will actually be the result most of the time so it's not
				// too terrible.
				if(isReadOperation(operation) && address != 0xc000) {
					// Ensure any enqueued video changes are applied before grabbing the
					// vapour value.
					if(video_.has_deferred_actions()) {
						update_video();
					}
					*value = video_.get_last_read_value(cycles_since_video_update_);
				}

				switch(address) {
					default:
						if(isReadOperation(operation)) {
							// Read-only switches.
							switch(address) {
								default: break;

								case 0xc000:
									*value = keyboard_.get_keyboard_input();
								break;
								case 0xc001: case 0xc002: case 0xc003: case 0xc004: case 0xc005: case 0xc006: case 0xc007:
								case 0xc008: case 0xc009: case 0xc00a: case 0xc00b: case 0xc00c: case 0xc00d: case 0xc00e: case 0xc00f:
									*value = (*value & 0x80) | (keyboard_.get_keyboard_input() & 0x7f);
								break;

								case 0xc061:	// Switch input 0.
									*value &= 0x7f;
									if(
										joysticks_.button(0) ||
										(is_iie(model) && keyboard_.open_apple_is_pressed)
									)
										*value |= 0x80;
								break;
								case 0xc062:	// Switch input 1.
									*value &= 0x7f;
									if(
										joysticks_.button(1) ||
										(is_iie(model) && keyboard_.closed_apple_is_pressed)
									)
										*value |= 0x80;
								break;
								case 0xc063:	// Switch input 2.
									*value &= 0x7f;
									if(joysticks_.button(2))
										*value |= 0x80;
								break;

								case 0xc064:	// Analogue input 0.
								case 0xc065:	// Analogue input 1.
								case 0xc066:	// Analogue input 2.
								case 0xc067: {	// Analogue input 3.
									const size_t input = address - 0xc064;
									*value &= 0x7f;
									if(!joysticks_.analogue_channel_is_discharged(input)) {
										*value |= 0x80;
									}
								} break;

								// The IIe-only state reads follow...
#define IIeSwitchRead(s)	*value = keyboard_.get_keyboard_input(); if(is_iie(model)) *value = (*value & 0x7f) | (s ? 0x80 : 0x00);
								case 0xc011:	IIeSwitchRead(language_card_.state().bank2);								break;
								case 0xc012:	IIeSwitchRead(language_card_.state().read);									break;
								case 0xc013:	IIeSwitchRead(auxiliary_switches_.switches().read_auxiliary_memory);		break;
								case 0xc014:	IIeSwitchRead(auxiliary_switches_.switches().write_auxiliary_memory);		break;
								case 0xc015:	IIeSwitchRead(auxiliary_switches_.switches().internal_CX_rom);				break;
								case 0xc016:	IIeSwitchRead(auxiliary_switches_.switches().alternative_zero_page);		break;
								case 0xc017:	IIeSwitchRead(auxiliary_switches_.switches().slot_C3_rom);					break;
								case 0xc018:	IIeSwitchRead(video_.get_80_store());										break;
								case 0xc019:	IIeSwitchRead(video_.get_is_vertical_blank(cycles_since_video_update_));	break;
								case 0xc01a:	IIeSwitchRead(video_.get_text());											break;
								case 0xc01b:	IIeSwitchRead(video_.get_mixed());											break;
								case 0xc01c:	IIeSwitchRead(video_.get_page2());											break;
								case 0xc01d:	IIeSwitchRead(video_.get_high_resolution());								break;
								case 0xc01e:	IIeSwitchRead(video_.get_alternative_character_set());						break;
								case 0xc01f:	IIeSwitchRead(video_.get_80_columns());										break;
#undef IIeSwitchRead

								case 0xc07f:
									if(is_iie(model)) *value = (*value & 0x7f) | (video_.get_annunciator_3() ? 0x80 : 0x00);
								break;
							}
						} else {
							// Write-only switches. All IIe as currently implemented.
							if(is_iie(model)) {
								auxiliary_switches_.access(address, false);
								switch(address) {
									default: break;

									case 0xc000:
									case 0xc001:
										update_video();
										video_.set_80_store(address&1);
									break;

									case 0xc00c:
									case 0xc00d:
										update_video();
										video_.set_80_columns(address&1);
									break;

									case 0xc00e:
									case 0xc00f:
										update_video();
										video_.set_alternative_character_set(address&1);
									break;
								}
							}
						}
					break;

					case 0xc070: joysticks_.access_c070(); break;

					/* Switches triggered by reading or writing. */
					case 0xc050:
					case 0xc051:
						update_video();
						video_.set_text(address&1);
					break;
					case 0xc052:	update_video();		video_.set_mixed(false);		break;
					case 0xc053:	update_video();		video_.set_mixed(true);			break;
					case 0xc054:
					case 0xc055:
						update_video();
						video_.set_page2(address&1);
						auxiliary_switches_.access(address, isReadOperation(operation));
					break;
					case 0xc056:
					case 0xc057:
						update_video();
						video_.set_high_resolution(address&1);
						auxiliary_switches_.access(address, isReadOperation(operation));
					break;

					case 0xc05e:
					case 0xc05f:
						if(is_iie(model)) {
							update_video();
							video_.set_annunciator_3(!(address&1));
						}
					break;

					case 0xc010:
						keyboard_.clear_keyboard_input();

						// On the IIe, reading C010 returns additional key info.
						if(is_iie(model) && isReadOperation(operation)) {
							*value = (keyboard_.get_key_is_down() ? 0x80 : 0x00) | (keyboard_.get_keyboard_input() & 0x7f);
						}
					break;

					case 0xc030: case 0xc031: case 0xc032: case 0xc033: case 0xc034: case 0xc035: case 0xc036: case 0xc037:
					case 0xc038: case 0xc039: case 0xc03a: case 0xc03b: case 0xc03c: case 0xc03d: case 0xc03e: case 0xc03f:
						update_audio();
						audio_toggle_.set_output(!audio_toggle_.get_output());
					break;

					case 0xc080: case 0xc084: case 0xc088: case 0xc08c:
					case 0xc081: case 0xc085: case 0xc089: case 0xc08d:
					case 0xc082: case 0xc086: case 0xc08a: case 0xc08e:
					case 0xc083: case 0xc087: case 0xc08b: case 0xc08f:
						language_card_.access(address, isReadOperation(operation));
					break;
				}

				/*
					Communication with cards follows.
				*/

				if(!read_pages_[address >> 8] && address >= 0xc090 && address < 0xd000) {
					// If this is a card access, figure out which card is at play before determining
					// the totality of who needs messaging.
					size_t card_number = 0;
					Apple::II::Card::Select select = Apple::II::Card::None;

					if(address >= 0xc800) {
						/*
							Decode the 2kb area used for additional ROMs.
							This is shared by all cards.
						*/
						card_number = active_card_;
						select = Apple::II::Card::C8Region;

						// An access to $cfff will disable the active card.
						if(address == 0xcfff) {
							active_card_ = NoActiveCard;
						}
					} else if(address >= 0xc100) {
						/*
							Decode the area conventionally used by cards for ROMs:
								0xCn00 to 0xCnff: card n.

							This also sets the active card for the C8 region.
						*/
						active_card_ = card_number = (address - 0xc100) >> 8;
						select = Apple::II::Card::IO;
					} else {
						/*
							Decode the area conventionally used by cards for registers:
								C0n0 to C0nF: card n - 8.
						*/
						card_number = (address - 0xc090) >> 4;
						select = Apple::II::Card::Device;
					}

					// If the selected card is a just-in-time card, update the just-in-time cards,
					// and then message it specifically.
					const bool is_read = isReadOperation(operation);
					Apple::II::Card *const target = cards_[size_t(card_number)].get();
					if(target && !is_every_cycle_card(target)) {
						update_just_in_time_cards();
						target->perform_bus_operation(select, is_read, address, value);
					}

					// Update all the every-cycle cards regardless, but send them a ::None select if they're
					// not the one actually selected.
					for(const auto &card: every_cycle_cards_) {
						card->run_for(Cycles(1), is_stretched_cycle);
						card->perform_bus_operation(
							(card == target) ? select : Apple::II::Card::None,
							is_read, address, value);
					}
					has_updated_cards = true;
				}
			}

			if(!has_updated_cards && !every_cycle_cards_.empty()) {
				// Update all every-cycle cards and give them the cycle.
				const bool is_read = isReadOperation(operation);
				for(const auto &card: every_cycle_cards_) {
					card->run_for(Cycles(1), is_stretched_cycle);
					card->perform_bus_operation(Apple::II::Card::None, is_read, address, value);
				}
			}

			// Update the card lists if any mutations are due.
			if(card_lists_are_dirty_) {
				card_lists_are_dirty_ = false;

				// There's only one counter of time since update
				// for just-in-time cards. If something new is
				// transitioning, that needs to be zeroed.
				if(card_became_just_in_time_) {
					card_became_just_in_time_ = false;
					update_just_in_time_cards();
				}

				// Clear the two lists and repopulate.
				every_cycle_cards_.clear();
				just_in_time_cards_.clear();
				for(const auto &card: cards_) {
					if(!card) continue;
					if(is_every_cycle_card(card.get())) {
						every_cycle_cards_.push_back(card.get());
					} else {
						just_in_time_cards_.push_back(card.get());
					}
				}
			}

			// Update analogue charge level.
			joysticks_.update_charge();

			return Cycles(1);
		}